

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O2

TAG * __thiscall HTML::TAG::text<char[26]>(TAG *this,char (*value) [26])

{
  std::operator<<((ostream *)&this->field_0x38,*value);
  text(this);
  return this;
}

Assistant:

TAG &text(const T &value) {
    m_value << value;
    text();
    return *this;
  }